

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c
# Opt level: O0

_Bool tbl_IsVictory(void)

{
  Card_t *pCVar1;
  Card_t *cardPtr;
  ECardColor_t cc;
  
  cardPtr._0_4_ = 0;
  while( true ) {
    if (3 < (uint)cardPtr) {
      return true;
    }
    pCVar1 = stk_CTopCard(ColorStacks + (uint)cardPtr);
    if ((pCVar1 == (Card_t *)0x0) || (pCVar1->m_type != CT_KING)) break;
    cardPtr._0_4_ = (uint)cardPtr + 1;
  }
  return false;
}

Assistant:

bool tbl_IsVictory(void)
{
  for (ECardColor_t cc = CC_SPADES; cc <= CC_DIAMONDS; cc++) {
    const Card_t* cardPtr = stk_CTopCard(&ColorStacks[cc]);
    if (!cardPtr || cardPtr->m_type != CT_KING) {
      return false;
    }
  }
  return true;
}